

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_formatimpl.cpp
# Opt level: O0

int32_t icu_63::number::impl::NumberFormatterImpl::writeNumber
                  (MicroProps *micros,DecimalQuantity *quantity,NumberStringBuilder *string,
                  int32_t index,UErrorCode *status)

{
  NumberStringBuilder *pNVar1;
  uint uVar2;
  int32_t iVar3;
  int iVar4;
  ulong uVar5;
  UnicodeString local_108;
  UnicodeString local_c8;
  UnicodeString local_78;
  int local_34;
  UErrorCode *pUStack_30;
  int32_t length;
  UErrorCode *status_local;
  NumberStringBuilder *pNStack_20;
  int32_t index_local;
  NumberStringBuilder *string_local;
  DecimalQuantity *quantity_local;
  MicroProps *micros_local;
  
  local_34 = 0;
  pUStack_30 = status;
  status_local._4_4_ = index;
  pNStack_20 = string;
  string_local = (NumberStringBuilder *)quantity;
  quantity_local = (DecimalQuantity *)micros;
  uVar2 = (*(quantity->super_IFixedDecimal)._vptr_IFixedDecimal[4])();
  pNVar1 = pNStack_20;
  if ((uVar2 & 1) == 0) {
    uVar5 = (**(code **)(*(long *)string_local + 0x18))();
    pNVar1 = pNStack_20;
    if ((uVar5 & 1) == 0) {
      iVar3 = writeIntegerDigits((MicroProps *)quantity_local,(DecimalQuantity *)string_local,
                                 pNStack_20,local_34 + status_local._4_4_,pUStack_30);
      local_34 = iVar3 + local_34;
      iVar3 = DecimalQuantity::getLowerDisplayMagnitude((DecimalQuantity *)string_local);
      pNVar1 = pNStack_20;
      if ((iVar3 < 0) || (*(int *)&quantity_local[1].bogus == 1)) {
        iVar4 = local_34 + status_local._4_4_;
        if ((quantity_local[1].scale & 1) == 0) {
          DecimalFormatSymbols::getSymbol
                    (&local_108,*(DecimalFormatSymbols **)&quantity_local[1].precision,
                     kDecimalSeparatorSymbol);
        }
        else {
          DecimalFormatSymbols::getSymbol
                    (&local_108,*(DecimalFormatSymbols **)&quantity_local[1].precision,
                     kMonetarySeparatorSymbol);
        }
        iVar3 = NumberStringBuilder::insert
                          (pNVar1,iVar4,&local_108,UNUM_DECIMAL_SEPARATOR_FIELD,pUStack_30);
        local_34 = iVar3 + local_34;
        icu_63::UnicodeString::~UnicodeString(&local_108);
      }
      iVar3 = writeFractionDigits((MicroProps *)quantity_local,(DecimalQuantity *)string_local,
                                  pNStack_20,local_34 + status_local._4_4_,pUStack_30);
      local_34 = iVar3 + local_34;
    }
    else {
      iVar4 = local_34 + status_local._4_4_;
      DecimalFormatSymbols::getSymbol
                (&local_c8,*(DecimalFormatSymbols **)&quantity_local[1].precision,kNaNSymbol);
      iVar3 = NumberStringBuilder::insert(pNVar1,iVar4,&local_c8,UNUM_INTEGER_FIELD,pUStack_30);
      local_34 = iVar3 + local_34;
      icu_63::UnicodeString::~UnicodeString(&local_c8);
    }
  }
  else {
    iVar4 = local_34 + status_local._4_4_;
    DecimalFormatSymbols::getSymbol
              (&local_78,*(DecimalFormatSymbols **)&quantity_local[1].precision,kInfinitySymbol);
    iVar3 = NumberStringBuilder::insert(pNVar1,iVar4,&local_78,UNUM_INTEGER_FIELD,pUStack_30);
    local_34 = iVar3 + local_34;
    icu_63::UnicodeString::~UnicodeString(&local_78);
  }
  return local_34;
}

Assistant:

int32_t NumberFormatterImpl::writeNumber(const MicroProps& micros, DecimalQuantity& quantity,
                                         NumberStringBuilder& string, int32_t index,
                                         UErrorCode& status) {
    int32_t length = 0;
    if (quantity.isInfinite()) {
        length += string.insert(
                length + index,
                micros.symbols->getSymbol(DecimalFormatSymbols::ENumberFormatSymbol::kInfinitySymbol),
                UNUM_INTEGER_FIELD,
                status);

    } else if (quantity.isNaN()) {
        length += string.insert(
                length + index,
                micros.symbols->getSymbol(DecimalFormatSymbols::ENumberFormatSymbol::kNaNSymbol),
                UNUM_INTEGER_FIELD,
                status);

    } else {
        // Add the integer digits
        length += writeIntegerDigits(micros, quantity, string, length + index, status);

        // Add the decimal point
        if (quantity.getLowerDisplayMagnitude() < 0 || micros.decimal == UNUM_DECIMAL_SEPARATOR_ALWAYS) {
            length += string.insert(
                    length + index,
                    micros.useCurrency ? micros.symbols->getSymbol(
                            DecimalFormatSymbols::ENumberFormatSymbol::kMonetarySeparatorSymbol) : micros
                            .symbols
                            ->getSymbol(
                                    DecimalFormatSymbols::ENumberFormatSymbol::kDecimalSeparatorSymbol),
                    UNUM_DECIMAL_SEPARATOR_FIELD,
                    status);
        }

        // Add the fraction digits
        length += writeFractionDigits(micros, quantity, string, length + index, status);
    }

    return length;
}